

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_random.h
# Opt level: O2

int __thiscall FastRandom::next(FastRandom *this,int min,int max)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = this->y;
  uVar2 = this->x << 0x10 ^ this->x;
  uVar2 = uVar2 >> 5 ^ uVar2;
  this->x = uVar1;
  this->y = this->z;
  uVar1 = uVar2 * 2 ^ uVar1 ^ uVar2 ^ this->z;
  this->z = uVar1;
  return min + (int)(uVar1 % (((long)max - (long)min) + 1U));
}

Assistant:

int next(int min=0, int max=std::numeric_limits<int>::max()) {
        x ^= x << 16;
        x ^= x >> 5;
        x ^= x << 1;

        unsigned long t = x;
        x = y;
        y = z;
        z = t ^ x ^ y;

        return min + (unsigned int) (z % (((unsigned long) max) - min + 1));
    }